

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

void GPU_GetRegisteredRendererList(GPU_RendererID *renderers_array)

{
  int iVar1;
  undefined4 uVar2;
  GPU_RendererID *pGVar3;
  long lVar4;
  int local_18;
  int local_14;
  int i;
  int count;
  GPU_RendererID *renderers_array_local;
  
  gpu_init_renderer_register();
  local_14 = 0;
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    if (_gpu_renderer_register[local_18].id.renderer != 0) {
      pGVar3 = renderers_array + local_14;
      lVar4 = (long)local_18;
      pGVar3->name = _gpu_renderer_register[lVar4].id.name;
      iVar1 = _gpu_renderer_register[lVar4].id.major_version;
      pGVar3->renderer = _gpu_renderer_register[lVar4].id.renderer;
      pGVar3->major_version = iVar1;
      uVar2 = *(undefined4 *)&_gpu_renderer_register[lVar4].id.field_0x14;
      pGVar3->minor_version = _gpu_renderer_register[lVar4].id.minor_version;
      *(undefined4 *)&pGVar3->field_0x14 = uVar2;
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void GPU_GetRegisteredRendererList(GPU_RendererID* renderers_array)
{
	int count;
	int i;

	gpu_init_renderer_register();

	count = 0;
	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer != GPU_RENDERER_UNKNOWN)
		{
			renderers_array[count] = _gpu_renderer_register[i].id;
			count++;
		}
	}
}